

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>
wabt::MakeUnique<wabt::MemoryImport>(void)

{
  MemoryImport *this;
  __uniq_ptr_data<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>,_true,_true> in_RDI;
  
  this = (MemoryImport *)operator_new(0x88);
  MemoryImport::MemoryImport(this,(string_view)ZEXT816(0));
  *(MemoryImport **)
   in_RDI.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
   super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
   super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>,_true,_true>)
         (tuple<wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>
         .super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}